

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void saveImage(char *filepath,GLFWwindow *w)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  allocator_type local_41;
  int height;
  int width;
  vector<char,_std::allocator<char>_> buffer;
  
  glfwGetFramebufferSize(w,&width,&height);
  uVar1 = (long)width * 3;
  iVar3 = (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) % 4);
  iVar2 = 4 - iVar3;
  if (iVar3 == 0) {
    iVar2 = 0;
  }
  std::vector<char,_std::allocator<char>_>::vector
            (&buffer,(long)height * ((long)iVar2 + uVar1),&local_41);
  (*glad_glPixelStorei)(0xd05,4);
  (*glad_glReadBuffer)(0x404);
  (*glad_glReadPixels)
            (0,0,width,height,0x1907,0x1401,
             buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start);
  stbi__flip_vertically_on_write = 1;
  stbi_write_png(filepath,width,height,3,
                 buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,(int)((long)iVar2 + uVar1));
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buffer.super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

void saveImage(const char filepath[], GLFWwindow* w) {
	int width, height;
	glfwGetFramebufferSize(w, &width, &height);
	GLsizei nrChannels = 3;
	GLsizei stride = nrChannels * width;
	stride += (stride % 4) ? (4 - stride % 4) : 0;
	GLsizei bufferSize = stride * height;
	std::vector<char> buffer(bufferSize);
	glPixelStorei(GL_PACK_ALIGNMENT, 4);
	glReadBuffer(GL_FRONT);
	glReadPixels(0, 0, width, height, GL_RGB, GL_UNSIGNED_BYTE, buffer.data());
	stbi_flip_vertically_on_write(true);
	stbi_write_png(filepath, width, height, nrChannels, buffer.data(), stride);
}